

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_names.c
# Opt level: O0

int OBJ_NAME_new_index(hash_func *hash_func,cmp_func *cmp_func,free_func *free_func)

{
  int iVar1;
  NAME_FUNCS *name_funcs;
  int push;
  int i;
  int ret;
  NAME_FUNCS *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_4;
  
  local_4 = 0;
  iVar1 = OBJ_NAME_init();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = CRYPTO_THREAD_write_lock(in_stack_ffffffffffffffc8);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      if (name_funcs_stack == (stack_st_NAME_FUNCS *)0x0) {
        name_funcs_stack = sk_NAME_FUNCS_new_null();
      }
      if (name_funcs_stack != (stack_st_NAME_FUNCS *)0x0) {
        local_4 = names_type_num;
        names_type_num = names_type_num + 1;
        for (iVar1 = sk_NAME_FUNCS_num((stack_st_NAME_FUNCS *)0x2a0c0a); iVar1 < names_type_num;
            iVar1 = iVar1 + 1) {
          in_stack_ffffffffffffffc8 =
               (NAME_FUNCS *)
               CRYPTO_zalloc((size_t)free_func,(char *)CONCAT44(local_4,iVar1),
                             in_stack_ffffffffffffffd4);
          if (in_stack_ffffffffffffffc8 == (NAME_FUNCS *)0x0) {
            ERR_new();
            ERR_set_debug((char *)free_func,local_4,
                          (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
            ERR_set_error(8,0xc0100,(char *)0x0);
            local_4 = 0;
            goto LAB_002a0d6d;
          }
          in_stack_ffffffffffffffc8->hash_func = ossl_lh_strcasehash;
          in_stack_ffffffffffffffc8->cmp_func = strcasecmp;
          in_stack_ffffffffffffffd4 =
               sk_NAME_FUNCS_push((stack_st_NAME_FUNCS *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                  in_stack_ffffffffffffffc8);
          if (in_stack_ffffffffffffffd4 == 0) {
            ERR_new();
            ERR_set_debug((char *)free_func,local_4,
                          (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
            ERR_set_error(8,0xc0100,(char *)0x0);
            CRYPTO_free(in_stack_ffffffffffffffc8);
            local_4 = 0;
            goto LAB_002a0d6d;
          }
        }
        in_stack_ffffffffffffffc8 =
             sk_NAME_FUNCS_value((stack_st_NAME_FUNCS *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        if (hash_func != (hash_func *)0x0) {
          in_stack_ffffffffffffffc8->hash_func = (_func_unsigned_long_char_ptr *)hash_func;
        }
        if (cmp_func != (cmp_func *)0x0) {
          in_stack_ffffffffffffffc8->cmp_func = (_func_int_char_ptr_char_ptr *)cmp_func;
        }
        if (free_func != (free_func *)0x0) {
          in_stack_ffffffffffffffc8->free_func = (_func_void_char_ptr_int_char_ptr *)free_func;
        }
      }
LAB_002a0d6d:
      CRYPTO_THREAD_unlock(in_stack_ffffffffffffffc8);
    }
  }
  return local_4;
}

Assistant:

int OBJ_NAME_new_index(unsigned long (*hash_func) (const char *),
                       int (*cmp_func) (const char *, const char *),
                       void (*free_func) (const char *, int, const char *))
{
    int ret = 0, i, push;
    NAME_FUNCS *name_funcs;

    if (!OBJ_NAME_init())
        return 0;

    if (!CRYPTO_THREAD_write_lock(obj_lock))
        return 0;

    if (name_funcs_stack == NULL)
        name_funcs_stack = sk_NAME_FUNCS_new_null();
    if (name_funcs_stack == NULL) {
        /* ERROR */
        goto out;
    }
    ret = names_type_num;
    names_type_num++;
    for (i = sk_NAME_FUNCS_num(name_funcs_stack); i < names_type_num; i++) {
        name_funcs = OPENSSL_zalloc(sizeof(*name_funcs));
        if (name_funcs == NULL) {
            ERR_raise(ERR_LIB_OBJ, ERR_R_MALLOC_FAILURE);
            ret = 0;
            goto out;
        }
        name_funcs->hash_func = ossl_lh_strcasehash;
        name_funcs->cmp_func = obj_strcasecmp;
        push = sk_NAME_FUNCS_push(name_funcs_stack, name_funcs);

        if (!push) {
            ERR_raise(ERR_LIB_OBJ, ERR_R_MALLOC_FAILURE);
            OPENSSL_free(name_funcs);
            ret = 0;
            goto out;
        }
    }
    name_funcs = sk_NAME_FUNCS_value(name_funcs_stack, ret);
    if (hash_func != NULL)
        name_funcs->hash_func = hash_func;
    if (cmp_func != NULL)
        name_funcs->cmp_func = cmp_func;
    if (free_func != NULL)
        name_funcs->free_func = free_func;

out:
    CRYPTO_THREAD_unlock(obj_lock);
    return ret;
}